

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::yarn3s_&,_const_trng::yarn3s_&> * __thiscall
Catch::ExprLhs<trng::yarn3s_const&>::operator==
          (BinaryExpr<const_trng::yarn3s_&,_const_trng::yarn3s_&> *__return_storage_ptr__,
          ExprLhs<trng::yarn3s_const&> *this,yarn3s *rhs)

{
  yarn3s *pyVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator==(*(yarn3s **)this,rhs);
  pyVar1 = *(yarn3s **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002e9f50;
  __return_storage_ptr__->m_lhs = pyVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }